

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_loop_jit(jit_State *J,TraceNo lnk,LoopEvent ev)

{
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  TraceNo in_stack_ffffffffffffffe8;
  TraceLink in_stack_ffffffffffffffec;
  
  if ((*(int *)(in_RDI + 0x9a8) == 0) && (*(int *)(in_RDI + 0x9ac) == 0)) {
    lj_trace_err((jit_State *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  }
  if (in_EDX != 0) {
    *(undefined4 *)(in_RDI + 0xd8) = 0;
    if ((*(long *)(in_RDI + 0x70) == *(long *)(in_RDI + 0x9a0)) &&
       (*(int *)(in_RDI + 0xe4) + *(int *)(in_RDI + 0xe8) == 0)) {
      lj_record_stop((jit_State *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                     in_stack_ffffffffffffffe8);
    }
    else {
      lj_record_stop((jit_State *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                     in_stack_ffffffffffffffe8);
    }
  }
  return;
}

Assistant:

static void rec_loop_jit(jit_State *J, TraceNo lnk, LoopEvent ev)
{
  if (J->parent == 0 && J->exitno == 0) {  /* Root trace hit an inner loop. */
    /* Better let the inner loop spawn a side trace back here. */
    lj_trace_err(J, LJ_TRERR_LINNER);
  } else if (ev != LOOPEV_LEAVE) {  /* Side trace enters a compiled loop. */
    J->instunroll = 0;  /* Cannot continue across a compiled loop op. */
    if (J->pc == J->startpc && J->framedepth + J->retdepth == 0)
      lj_record_stop(J, LJ_TRLINK_LOOP, J->cur.traceno);  /* Form extra loop. */
    else
      lj_record_stop(J, LJ_TRLINK_ROOT, lnk);  /* Link to the loop. */
  }  /* Side trace continues across a loop that's left or not entered. */
}